

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathNodeSetContains(xmlNodeSetPtr cur,xmlNodePtr val)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNsPtr ns2;
  xmlNsPtr ns1;
  int i;
  xmlNodePtr val_local;
  xmlNodeSetPtr cur_local;
  
  if ((cur != (xmlNodeSetPtr)0x0) && (val != (xmlNodePtr)0x0)) {
    if (val->type == XML_NAMESPACE_DECL) {
      for (ns1._4_4_ = 0; ns1._4_4_ < cur->nodeNr; ns1._4_4_ = ns1._4_4_ + 1) {
        if (cur->nodeTab[ns1._4_4_]->type == XML_NAMESPACE_DECL) {
          pxVar1 = cur->nodeTab[ns1._4_4_];
          if (val == pxVar1) {
            return 1;
          }
          if (((val->_private != (void *)0x0) && (pxVar1->_private == val->_private)) &&
             (iVar2 = xmlStrEqual((xmlChar *)val->children,(xmlChar *)pxVar1->children), iVar2 != 0)
             ) {
            return 1;
          }
        }
      }
    }
    else {
      for (ns1._4_4_ = 0; ns1._4_4_ < cur->nodeNr; ns1._4_4_ = ns1._4_4_ + 1) {
        if (cur->nodeTab[ns1._4_4_] == val) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int
xmlXPathNodeSetContains (xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(0);
    if (val->type == XML_NAMESPACE_DECL) {
	for (i = 0; i < cur->nodeNr; i++) {
	    if (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) {
		xmlNsPtr ns1, ns2;

		ns1 = (xmlNsPtr) val;
		ns2 = (xmlNsPtr) cur->nodeTab[i];
		if (ns1 == ns2)
		    return(1);
		if ((ns1->next != NULL) && (ns2->next == ns1->next) &&
	            (xmlStrEqual(ns1->prefix, ns2->prefix)))
		    return(1);
	    }
	}
    } else {
	for (i = 0; i < cur->nodeNr; i++) {
	    if (cur->nodeTab[i] == val)
		return(1);
	}
    }
    return(0);
}